

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
          (Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *this)

{
  _Head_base<0UL,_Kernel::RobSubstitution_*,_false> _Var1;
  Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
  *this_00;
  unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_> *puVar2;
  _Head_base<0UL,_Kernel::RobSubstitution_*,_false> local_20;
  
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
       ._M_t.
       super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
       .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl != (RobSubstitution *)0x0) &&
     (((0 < *(int *)((long)&(_Var1._M_head_impl)->_bindings + 0x10) ||
       (0 < *(int *)((long)&(_Var1._M_head_impl)->_outputVarBindings + 0x10))) &&
      (Recycled<Kernel::RobSubstitution,Lib::DefaultReset,Lib::DefaultKeepRecycled>::memAlive ==
       '\x01')))) {
    Kernel::RobSubstitution::reset(_Var1._M_head_impl);
    this_00 = mem();
    _Var1._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
         ._M_t.
         super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
         .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>.
    _M_t.
    super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
    .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl = (RobSubstitution *)0x0;
    puVar2 = this_00->_cursor;
    if (puVar2 == this_00->_end) {
      Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
      ::expand(this_00);
      puVar2 = this_00->_cursor;
    }
    (puVar2->_M_t).
    super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>.
    _M_t.
    super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
    .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl = _Var1._M_head_impl;
    local_20._M_head_impl = (RobSubstitution *)0x0;
    this_00->_cursor = this_00->_cursor + 1;
    std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>::
    ~unique_ptr((unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                 *)&local_20);
  }
  std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>::
  ~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }